

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minireflect.h
# Opt level: O3

void flatbuffers::IterateObject(uint8_t *obj,TypeTable *type_table,IterationVisitor *visitor)

{
  uint *puVar1;
  TypeCode TVar2;
  SequenceType SVar3;
  TypeTable *type_table_00;
  char *pcVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  uint *val;
  ElementaryType type;
  uint *local_68;
  uint *local_60;
  long local_58;
  
  (**visitor->_vptr_IterationVisitor)(visitor);
  if (type_table->num_elems != 0) {
    local_60 = (uint *)0x0;
    lVar8 = 0;
    local_58 = 0;
    uVar7 = 0;
    do {
      TVar2 = type_table->type_codes[uVar7];
      if ((short)((uint)(int)(short)TVar2 >> 5) < 0) {
        type_table_00 = (TypeTable *)0x0;
      }
      else {
        type_table_00 = (*type_table->type_refs[(uint)(int)(short)TVar2 >> 5 & 0xffff])();
      }
      if (type_table->names == (char **)0x0) {
        pcVar4 = (char *)0x0;
      }
      else {
        pcVar4 = type_table->names[uVar7];
      }
      if (type_table->st == ST_TABLE) {
        if (0x7ffd < ((uint)uVar7 & 0xffff)) {
          __assert_fail("offset < std::numeric_limits<voffset_t>::max()",
                        "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/flatbuffer_builder.h"
                        ,0x31,"voffset_t flatbuffers::FieldIndexToOffset(voffset_t)");
        }
        lVar5 = (ulong)((uint)uVar7 & 0x7fff) * 2 + 4;
        if (((ushort)lVar5 < *(ushort *)(obj + -(long)*(int *)obj)) &&
           (*(ushort *)(obj + (lVar5 - *(int *)obj)) != 0)) {
          uVar9 = (ulong)*(ushort *)(obj + (lVar5 - *(int *)obj));
          goto LAB_0018f394;
        }
        local_68 = (uint *)0x0;
      }
      else {
        uVar9 = type_table->values[uVar7];
LAB_0018f394:
        local_68 = (uint *)(obj + uVar9);
      }
      type = (ushort)TVar2 & (ET_STRING|ET_UCHAR);
      (*visitor->_vptr_IterationVisitor[2])
                (visitor,uVar7,lVar8,(ulong)type,(ulong)(((ushort)TVar2 & 0x10) >> 4),type_table_00,
                 pcVar4,local_68);
      if (local_68 == (uint *)0x0) {
        local_68 = (uint *)0x0;
      }
      else {
        lVar8 = lVar8 + 1;
        if (((ushort)TVar2 & 0x10) == 0) {
          IterateValue(type,(uint8_t *)local_68,type_table_00,(uint8_t *)local_60,-1,visitor);
        }
        else {
          if (type_table->st == ST_TABLE) {
            puVar1 = (uint *)((long)local_68 + (ulong)*local_68);
            val = puVar1 + 1;
            local_68 = (uint *)((ulong)*local_68 + (long)local_68);
            uVar9 = (ulong)*puVar1;
          }
          else {
            uVar9 = (ulong)type_table->array_sizes[local_58];
            local_58 = local_58 + 1;
            val = local_68;
          }
          (*visitor->_vptr_IterationVisitor[0x11])(visitor);
          if (uVar9 != 0) {
            uVar6 = 0;
            do {
              (*visitor->_vptr_IterationVisitor[0x13])(visitor,uVar6,(ulong)type,type_table_00,val);
              IterateValue(type,(uint8_t *)val,type_table_00,(uint8_t *)local_60,(soffset_t)uVar6,
                           visitor);
              switch(type) {
              case ET_UTYPE:
              case ET_BOOL:
              case ET_CHAR:
              case ET_UCHAR:
                lVar5 = 1;
                break;
              case ET_SHORT:
              case ET_USHORT:
                lVar5 = 2;
                break;
              case ET_INT:
              case ET_UINT:
              case ET_FLOAT:
              case ET_STRING:
                lVar5 = 4;
                break;
              case ET_LONG:
              case ET_ULONG:
              case ET_DOUBLE:
                lVar5 = 8;
                break;
              case ET_SEQUENCE:
                SVar3 = type_table_00->st;
                lVar5 = 4;
                if ((SVar3 != ST_TABLE) && (SVar3 != ST_UNION)) {
                  if (SVar3 != ST_STRUCT) {
                    __assert_fail("false",
                                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/minireflect.h"
                                  ,0x5d,
                                  "size_t flatbuffers::InlineSize(ElementaryType, const TypeTable *)"
                                 );
                  }
                  lVar5 = type_table_00->values[type_table_00->num_elems];
                }
                break;
              default:
                __assert_fail("false",
                              "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/minireflect.h"
                              ,0x5f,
                              "size_t flatbuffers::InlineSize(ElementaryType, const TypeTable *)");
              }
              val = (uint *)((long)val + lVar5);
              uVar6 = uVar6 + 1;
            } while (uVar9 != uVar6);
          }
          (*visitor->_vptr_IterationVisitor[0x12])(visitor);
        }
      }
      uVar7 = uVar7 + 1;
      local_60 = local_68;
    } while (uVar7 < type_table->num_elems);
  }
  (*visitor->_vptr_IterationVisitor[1])(visitor);
  return;
}

Assistant:

inline void IterateObject(const uint8_t *obj, const TypeTable *type_table,
                          IterationVisitor *visitor) {
  visitor->StartSequence();
  const uint8_t *prev_val = nullptr;
  size_t set_idx = 0;
  size_t array_idx = 0;
  for (size_t i = 0; i < type_table->num_elems; i++) {
    auto type_code = type_table->type_codes[i];
    auto type = static_cast<ElementaryType>(type_code.base_type);
    auto is_repeating = type_code.is_repeating != 0;
    auto ref_idx = type_code.sequence_ref;
    const TypeTable *ref = nullptr;
    if (ref_idx >= 0) { ref = type_table->type_refs[ref_idx](); }
    auto name = type_table->names ? type_table->names[i] : nullptr;
    const uint8_t *val = nullptr;
    if (type_table->st == ST_TABLE) {
      val = reinterpret_cast<const Table *>(obj)->GetAddressOf(
          FieldIndexToOffset(static_cast<voffset_t>(i)));
    } else {
      val = obj + type_table->values[i];
    }
    visitor->Field(i, set_idx, type, is_repeating, ref, name, val);
    if (val) {
      set_idx++;
      if (is_repeating) {
        auto elem_ptr = val;
        size_t size = 0;
        if (type_table->st == ST_TABLE) {
          // variable length vector
          val += ReadScalar<uoffset_t>(val);
          auto vec = reinterpret_cast<const Vector<uint8_t> *>(val);
          elem_ptr = vec->Data();
          size = vec->size();
        } else {
          // otherwise fixed size array
          size = type_table->array_sizes[array_idx];
          ++array_idx;
        }
        visitor->StartVector();
        for (size_t j = 0; j < size; j++) {
          visitor->Element(j, type, ref, elem_ptr);
          IterateValue(type, elem_ptr, ref, prev_val, static_cast<soffset_t>(j),
                       visitor);
          elem_ptr += InlineSize(type, ref);
        }
        visitor->EndVector();
      } else {
        IterateValue(type, val, ref, prev_val, -1, visitor);
      }
    }
    prev_val = val;
  }
  visitor->EndSequence();
}